

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O0

void __thiscall
duckdb::BitpackingScanState<long,_long>::Skip
          (BitpackingScanState<long,_long> *this,ColumnSegment *segment,idx_t skip_count)

{
  long lVar1;
  ulong uVar2;
  unsigned_long size;
  long *dst;
  ulong in_RDX;
  data_ptr_t in_RDI;
  long *decompression_ptr;
  idx_t skipping_this_algorithm_group;
  data_ptr_t decompression_group_start_pointer;
  data_ptr_t current_position_ptr;
  idx_t offset_in_compression_group;
  idx_t remaining_to_skip;
  idx_t meta_groups_to_skip;
  idx_t initial_group_offset;
  idx_t skipped;
  bool skip_sign_extend;
  data_ptr_t in_stack_ffffffffffffff88;
  unsigned_long local_40;
  ulong local_28;
  
  local_28 = 0;
  lVar1 = *(long *)(in_RDI + 0x4050);
  uVar2 = in_RDX + *(long *)(in_RDI + 0x4050) >> 0xb;
  if (uVar2 != 0) {
    *(ulong *)(in_RDI + 0x4060) = *(long *)(in_RDI + 0x4060) + (uVar2 - 1) * -4;
    LoadNextGroup((BitpackingScanState<long,_long> *)decompression_group_start_pointer);
    local_28 = (uVar2 - 1) * 0x800 + (0x800 - lVar1);
  }
  local_40 = in_RDX - local_28;
  if (((in_RDI[0x4028] == '\x02') || (in_RDI[0x4028] == '\x03')) || (in_RDI[0x4028] == '\x05')) {
    *(unsigned_long *)(in_RDI + 0x4050) = local_40 + *(long *)(in_RDI + 0x4050);
  }
  else {
    while (local_28 < in_RDX) {
      uVar2 = *(ulong *)(in_RDI + 0x4050);
      size = MinValue<unsigned_long>(local_40,0x20 - (uVar2 & 0x1f));
      data_ptr_cast<long>((long *)(in_RDI + 0x28));
      BitpackingPrimitives::UnPackBlock<long>(in_RDI,in_stack_ffffffffffffff88,'\0',false);
      dst = (long *)(in_RDI + (uVar2 & 0x1f) * 8 + 0x28);
      ApplyFrameOfReference<long>(dst,*(long *)(in_RDI + 0x4038),size);
      DeltaDecode<long>(dst,*(long *)(in_RDI + 0x4048),size);
      *(long *)(in_RDI + 0x4048) = dst[size - 1];
      local_28 = size + local_28;
      *(unsigned_long *)(in_RDI + 0x4050) = size + *(long *)(in_RDI + 0x4050);
      local_40 = local_40 - size;
    }
  }
  return;
}

Assistant:

void Skip(ColumnSegment &segment, idx_t skip_count) {
		bool skip_sign_extend = true;

		idx_t skipped = 0;
		idx_t initial_group_offset = current_group_offset;

		// This skips straight to the correct metadata group
		idx_t meta_groups_to_skip = (skip_count + current_group_offset) / BITPACKING_METADATA_GROUP_SIZE;
		if (meta_groups_to_skip) {

			// bitpacking_metadata_ptr points to the next metadata: this means we need to advance the pointer by n-1
			bitpacking_metadata_ptr -= (meta_groups_to_skip - 1) * sizeof(bitpacking_metadata_encoded_t);
			LoadNextGroup();
			// The first (partial) group we skipped
			skipped += BITPACKING_METADATA_GROUP_SIZE - initial_group_offset;
			// The remaining groups that were skipped
			skipped += (meta_groups_to_skip - 1) * BITPACKING_METADATA_GROUP_SIZE;
		}

		// Assert we can are in the correct metadata group
		idx_t remaining_to_skip = skip_count - skipped;
		D_ASSERT(current_group_offset + remaining_to_skip < BITPACKING_METADATA_GROUP_SIZE);

		if (current_group.mode == BitpackingMode::CONSTANT || current_group.mode == BitpackingMode::CONSTANT_DELTA ||
		    current_group.mode == BitpackingMode::FOR) {
			// Skipping within a constant or constant delta is done by increasing the current_group_offset
			skipped += remaining_to_skip;
			current_group_offset += remaining_to_skip;
		} else {
			// For DELTA we actually need to decompress from the current_group_offset up until the row we want to skip
			// to this is because we need that delta to be able to continue scanning from here
			D_ASSERT(current_group.mode == BitpackingMode::DELTA_FOR);

			while (skipped < skip_count) {
				// Calculate compression group offset and pointer
				idx_t offset_in_compression_group =
				    current_group_offset % BitpackingPrimitives::BITPACKING_ALGORITHM_GROUP_SIZE;
				data_ptr_t current_position_ptr = current_group_ptr + current_group_offset * current_width / 8;
				data_ptr_t decompression_group_start_pointer =
				    current_position_ptr - offset_in_compression_group * current_width / 8;

				idx_t skipping_this_algorithm_group =
				    MinValue(remaining_to_skip,
				             BitpackingPrimitives::BITPACKING_ALGORITHM_GROUP_SIZE - offset_in_compression_group);

				BitpackingPrimitives::UnPackBlock<T>(data_ptr_cast(decompression_buffer),
				                                     decompression_group_start_pointer, current_width,
				                                     skip_sign_extend);

				T *decompression_ptr = decompression_buffer + offset_in_compression_group;
				ApplyFrameOfReference<T_S>(reinterpret_cast<T_S *>(decompression_ptr),
				                           static_cast<T_S>(current_frame_of_reference), skipping_this_algorithm_group);
				DeltaDecode<T_S>(reinterpret_cast<T_S *>(decompression_ptr), static_cast<T_S>(current_delta_offset),
				                 skipping_this_algorithm_group);
				current_delta_offset = decompression_ptr[skipping_this_algorithm_group - 1];

				skipped += skipping_this_algorithm_group;
				current_group_offset += skipping_this_algorithm_group;
				remaining_to_skip -= skipping_this_algorithm_group;
			}
		}

		D_ASSERT(skipped == skip_count);
	}